

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader_factory.cc
# Opt level: O3

bool draco::FileReaderFactory::RegisterReader(OpenFunction open_function)

{
  iterator __position;
  long lVar1;
  vector<std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>(*)(std::__cxx11::string_const&),std::allocator<std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>(*)(std::__cxx11::string_const&)>>
  *this;
  long lVar2;
  _func_unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_RDI;
  bool bVar3;
  _func_unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_20;
  
  if (in_RDI == (_func_unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                 *)0x0) {
    bVar3 = false;
  }
  else {
    this = (vector<std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>(*)(std::__cxx11::string_const&),std::allocator<std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>(*)(std::__cxx11::string_const&)>>
            *)(anonymous_namespace)::GetFileReaderOpenFunctions_abi_cxx11_();
    __position._M_current =
         *(_func_unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
           ***)(this + 8);
    lVar1 = *(long *)this;
    if (__position._M_current ==
        *(_func_unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          ***)(this + 0x10)) {
      std::
      vector<std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>(*)(std::__cxx11::string_const&),std::allocator<std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>(*)(std::__cxx11::string_const&)>>
      ::
      _M_realloc_insert<std::unique_ptr<draco::FileReaderInterface,std::default_delete<draco::FileReaderInterface>>(*const&)(std::__cxx11::string_const&)>
                (this,__position,&local_20);
      lVar2 = *(long *)(this + 8);
    }
    else {
      *__position._M_current = in_RDI;
      lVar2 = *(long *)(this + 8) + 8;
      *(long *)(this + 8) = lVar2;
    }
    bVar3 = lVar2 - *(long *)this >> 3 == ((long)__position._M_current - lVar1 >> 3) + 1;
  }
  return bVar3;
}

Assistant:

bool FileReaderFactory::RegisterReader(OpenFunction open_function) {
  if (open_function == nullptr) {
    return false;
  }
  auto open_functions = GetFileReaderOpenFunctions();
  const size_t num_readers = open_functions->size();
  open_functions->push_back(open_function);
  return open_functions->size() == num_readers + 1;
}